

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculatorTests.cpp
# Opt level: O1

void __thiscall
ImagePositionCalculator_ImageMatchesMaxResolutionReturnsRectangleWithExactlyTheImageDimentions_Test
::
~ImagePositionCalculator_ImageMatchesMaxResolutionReturnsRectangleWithExactlyTheImageDimentions_Test
          (ImagePositionCalculator_ImageMatchesMaxResolutionReturnsRectangleWithExactlyTheImageDimentions_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImagePositionCalculator, ImageMatchesMaxResolutionReturnsRectangleWithExactlyTheImageDimentions)
{
    ImagePositionCalculator imagePositionCalculator;

    auto res = imagePositionCalculator.GetCenteredRectangleVertexCoordinates(1920, 1080, 1920, 1080);

    ASSERT_EQ(res[0], 0);
    ASSERT_EQ(res[1], 0);
    ASSERT_EQ(res[2], 0);
    ASSERT_EQ(res[3], 0);

    ASSERT_EQ(res[4], 1920);
    ASSERT_EQ(res[5], 0);
    ASSERT_EQ(res[6], 1);
    ASSERT_EQ(res[7], 0);

    ASSERT_EQ(res[8], 1920);
    ASSERT_EQ(res[9], 1080);
    ASSERT_EQ(res[10], 1);
    ASSERT_EQ(res[11], 1);

    ASSERT_EQ(res[12], 0);
    ASSERT_EQ(res[13], 1080);
    ASSERT_EQ(res[14], 0);
    ASSERT_EQ(res[15], 1);
}